

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

int stb_vorbis_seek_frame(stb_vorbis *f,uint sample_number)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint32 uVar5;
  uint32 uVar6;
  int iVar7;
  ulong uVar8;
  STBVorbisError SVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  uint end;
  ProbedPage left;
  int left_end;
  int mode;
  int right_end;
  uint local_8c;
  ProbedPage local_88;
  uint local_78;
  uint32 local_74;
  ProbedPage local_70;
  int local_64;
  double local_60;
  double local_58;
  ulong local_50;
  double local_48;
  ulong local_40;
  int local_34;
  
  if (f->push_mode != '\0') {
    f->error = VORBIS_invalid_api_mixing;
    return 0;
  }
  uVar3 = stb_vorbis_stream_length_in_samples(f);
  if (uVar3 == 0) {
    SVar9 = VORBIS_seek_without_length;
  }
  else {
    SVar9 = VORBIS_seek_invalid;
    if (sample_number <= uVar3) {
      uVar3 = f->blocksize_1 - f->blocksize_0 >> 2;
      uVar10 = sample_number - uVar3;
      if (sample_number < uVar3) {
        uVar10 = 0;
      }
      local_88.last_decoded_sample = (f->p_first).last_decoded_sample;
      local_88.page_start = (f->p_first).page_start;
      local_88.page_end = (f->p_first).page_end;
      do {
        if (local_88.last_decoded_sample != 0xffffffff) {
          if (uVar10 <= local_88.last_decoded_sample) {
            iVar4 = stb_vorbis_seek_start(f);
            if (iVar4 == 0) {
              return 0;
            }
            uVar3 = f->current_loc;
            goto LAB_0016079d;
          }
          uVar3 = (f->p_last).page_start;
          uVar12 = (ulong)uVar3;
          if (local_88.page_end == uVar3) goto LAB_001606a6;
          local_74 = (f->p_last).page_end;
          local_48 = (double)uVar10;
          local_78 = (f->p_last).last_decoded_sample;
          uVar8 = 0;
          local_60 = 0.0;
          local_58 = 0.0;
          uVar6 = local_88.page_end;
          uVar3 = local_78;
          goto LAB_00160916;
        }
        set_file_offset(f,local_88.page_end);
        iVar4 = get_seek_page_info(f,&local_88);
      } while (iVar4 != 0);
LAB_0016065e:
      stb_vorbis_seek_start(f);
      SVar9 = VORBIS_seek_failed;
    }
  }
  goto LAB_00160674;
  while (uVar8 = (ulong)((uint)local_50 + 1), uVar3 = local_70.last_decoded_sample,
        uVar6 != (uint)uVar12) {
LAB_00160916:
    uVar11 = (int)uVar12 - uVar6;
    local_50 = uVar8;
    local_40 = uVar12;
    if (uVar11 < 0x10001) {
      set_file_offset(f,uVar6);
    }
    else {
      if ((uint)uVar8 < 2) {
        if ((uint)uVar8 == 0) {
          local_60 = (double)(local_74 - local_88.page_start) / (double)local_78;
          dVar15 = (double)(uVar10 - local_88.last_decoded_sample) * local_60 +
                   (double)(local_88._0_8_ & 0xffffffff);
        }
        else {
          dVar15 = (local_48 - (double)uVar3) * local_60;
          dVar14 = 8000.0;
          if (8000.0 <= dVar15) {
            dVar14 = dVar15;
          }
          dVar15 = (double)(~-(ulong)(0.0 <= dVar15) & (ulong)dVar15 |
                           (ulong)dVar14 & -(ulong)(0.0 <= dVar15));
          uVar16 = 0;
          uVar17 = 0xc0bf4000;
          if (dVar15 <= -8000.0) {
            uVar16 = SUB84(dVar15,0);
            uVar17 = (undefined4)((ulong)dVar15 >> 0x20);
          }
          dVar15 = (double)(~-(ulong)(dVar15 < 0.0) & (ulong)dVar15 |
                           CONCAT44(uVar17,uVar16) & -(ulong)(dVar15 < 0.0));
          dVar15 = dVar15 + dVar15 + local_58;
        }
        local_58 = (double)((int)uVar12 - 0x10000);
        dVar14 = (double)uVar6;
        if ((double)uVar6 <= dVar15) {
          dVar14 = dVar15;
        }
        if (dVar14 <= local_58) {
          local_58 = dVar14;
        }
        uVar3 = (uint)(long)local_58;
      }
      else {
        uVar3 = (uVar6 + (uVar11 >> 1)) - 0x8000;
      }
      set_file_offset(f,uVar3);
      uVar5 = vorbis_find_page(f,(uint32 *)0x0,(uint32 *)0x0);
      if (uVar5 == 0) goto LAB_0016065e;
    }
    while( true ) {
      iVar4 = get_seek_page_info(f,&local_70);
      if (iVar4 == 0) goto LAB_0016065e;
      if (local_70.last_decoded_sample != 0xffffffff) break;
      set_file_offset(f,local_70.page_end);
    }
    uVar12 = local_40;
    if (local_70.page_start == (uint)local_40) {
      if ((1 < (uint)local_50) || (uVar11 < 0x10001)) break;
    }
    else if (uVar10 < local_70.last_decoded_sample) {
      local_74 = local_70.page_end;
      local_78 = local_70.last_decoded_sample;
      uVar12 = (ulong)local_70.page_start;
    }
    else {
      local_88._0_8_ = CONCAT44(local_70.page_end,local_70.page_start);
      local_88.last_decoded_sample = local_70.last_decoded_sample;
      uVar6 = local_70.page_end;
    }
  }
LAB_001606a6:
  uVar6 = local_88.page_start;
  set_file_offset(f,local_88.page_start);
  iVar4 = start_page(f);
  SVar9 = VORBIS_seek_failed;
  if (iVar4 != 0) {
    uVar3 = f->end_seg_with_known_loc;
    do {
      uVar12 = (ulong)uVar3;
      uVar10 = uVar3 + 1;
      while (uVar11 = (uint)uVar12, 0 < (int)uVar11) {
        uVar10 = uVar10 - 1;
        lVar2 = uVar12 - 1;
        uVar12 = uVar12 - 1;
        if (f->segments[lVar2] != 0xff) goto LAB_00160af9;
      }
      if ((f->page_flag & 1) == 0) {
        uVar10 = (int)uVar3 >> 0x1f & uVar3;
LAB_00160af9:
        f->current_loc_valid = 0;
        f->last_seg = 0;
        f->valid_bits = 0;
        f->packet_bytes = 0;
        f->bytes_in_seg = '\0';
        f->previous_length = 0;
        f->next_seg = uVar10;
        if (0 < (int)uVar11) {
          uVar12 = 0;
          do {
            skip(f,(uint)f->segments[uVar12]);
            uVar12 = uVar12 + 1;
          } while ((uVar11 & 0x7fffffff) != uVar12);
        }
        iVar4 = vorbis_pump_first_frame(f);
        if (iVar4 == 0) {
          return 0;
        }
        uVar3 = f->current_loc;
LAB_0016079d:
        SVar9 = VORBIS_seek_failed;
        if (uVar3 <= sample_number) {
          if (uVar3 < sample_number) {
            iVar4 = f->blocksize_1;
            iVar1 = f->blocksize_0;
            do {
              iVar7 = vorbis_decode_initial
                                (f,(int *)&local_88,(int *)&local_70,(int *)&local_8c,&local_34,
                                 &local_64);
              if (iVar7 == 0) goto LAB_001608d4;
              iVar7 = ilog(f->mode_count + -1);
              bVar13 = f->mode_config[local_64].blockflag != '\0';
              uVar10 = iVar7 + (uint)bVar13 * 2 + 8;
              uVar3 = iVar7 + (uint)bVar13 * 2 + 0xf;
              if (-1 < (short)uVar10) {
                uVar3 = uVar10;
              }
              iVar7 = (int)(short)uVar3 >> 3;
              f->bytes_in_seg = f->bytes_in_seg + (char)(uVar3 >> 3);
              f->packet_bytes = f->packet_bytes - iVar7;
              skip(f,-iVar7);
              iVar7 = f->next_seg;
              if (iVar7 == -1) {
                iVar7 = f->segment_count;
              }
              f->next_seg = iVar7 + -1;
              f->valid_bits = 0;
              uVar3 = (local_8c - local_88.page_start) + f->current_loc;
              if (sample_number < uVar3) {
                return 1;
              }
              if (sample_number < uVar3 + (iVar4 * 3 - iVar1 >> 2)) {
                vorbis_pump_first_frame(f);
              }
              else {
                f->current_loc = uVar3;
                f->previous_length = 0;
                maybe_start_packet(f);
                do {
                  iVar7 = get8_packet_raw(f);
                } while (iVar7 != -1);
              }
              uVar3 = f->current_loc;
            } while (uVar3 < sample_number);
          }
          if (uVar3 == sample_number) {
            return 1;
          }
LAB_001608d4:
          f->error = VORBIS_seek_failed;
          return 0;
        }
        break;
      }
      if (uVar6 < 0x10000) {
        uVar3 = f->first_audio_page_offset;
      }
      else {
        uVar3 = f->first_audio_page_offset;
        if (f->first_audio_page_offset < uVar6 - 0x10000) {
          uVar3 = uVar6 - 0x10000;
        }
      }
      do {
        set_file_offset(f,uVar3);
        uVar5 = vorbis_find_page(f,&local_8c,(uint32 *)0x0);
        if (uVar5 == 0) goto LAB_0016065e;
        uVar3 = local_8c;
      } while ((local_8c < uVar6) ||
              (uVar10 = stb_vorbis_get_file_offset(f), uVar3 = local_8c, uVar6 <= uVar10));
      uVar6 = stb_vorbis_get_file_offset(f);
      iVar4 = start_page(f);
      if (iVar4 == 0) goto LAB_0016065e;
      uVar3 = f->segment_count - 1;
    } while( true );
  }
LAB_00160674:
  f->error = SVar9;
  return 0;
}

Assistant:

int stb_vorbis_seek_frame(stb_vorbis *f, unsigned int sample_number)
{
   uint32 max_frame_samples;

   if (IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);

   // fast page-level search
   if (!seek_to_sample_coarse(f, sample_number))
      return 0;

   assert(f->current_loc_valid);
   assert(f->current_loc <= sample_number);

   // linear search for the relevant packet
   max_frame_samples = (f->blocksize_1*3 - f->blocksize_0) >> 2;
   while (f->current_loc < sample_number) {
      int left_start, left_end, right_start, right_end, mode, frame_samples;
      if (!peek_decode_initial(f, &left_start, &left_end, &right_start, &right_end, &mode))
         return error(f, VORBIS_seek_failed);
      // calculate the number of samples returned by the next frame
      frame_samples = right_start - left_start;
      if (f->current_loc + frame_samples > sample_number) {
         return 1; // the next frame will contain the sample
      } else if (f->current_loc + frame_samples + max_frame_samples > sample_number) {
         // there's a chance the frame after this could contain the sample
         vorbis_pump_first_frame(f);
      } else {
         // this frame is too early to be relevant
         f->current_loc += frame_samples;
         f->previous_length = 0;
         maybe_start_packet(f);
         flush_packet(f);
      }
   }
   // the next frame should start with the sample
   if (f->current_loc != sample_number) return error(f, VORBIS_seek_failed);
   return 1;
}